

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valcvt.h
# Opt level: O0

void __thiscall
mp::pre::ValuePresolverImpl::ValuePresolverImpl(ValuePresolverImpl *this,Env *env,BasicLogger *bts)

{
  undefined8 in_RDX;
  undefined8 *in_RDI;
  string *unaff_retaddr;
  ParamType in_stack_00000008;
  ModelValues<mp::pre::ValueMap<mp::pre::ValueNode,_mp::pre::BasicValuePresolver_&>_>
  *in_stack_00000010;
  Env *in_stack_ffffffffffffff58;
  BasicValuePresolver *in_stack_ffffffffffffff60;
  EntryItems *this_00;
  allocator<char> local_71;
  allocator<char> *in_stack_ffffffffffffff90;
  char *in_stack_ffffffffffffff98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffa0;
  allocator<char> local_39;
  string local_38 [32];
  undefined8 local_18;
  
  local_18 = in_RDX;
  BasicValuePresolver::BasicValuePresolver(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  *in_RDI = &PTR__ValuePresolverImpl_006dcc00;
  std::
  unordered_set<mp::pre::ValueNode_*,_std::hash<mp::pre::ValueNode_*>,_std::equal_to<mp::pre::ValueNode_*>,_std::allocator<mp::pre::ValueNode_*>_>
  ::unordered_set((unordered_set<mp::pre::ValueNode_*,_std::hash<mp::pre::ValueNode_*>,_std::equal_to<mp::pre::ValueNode_*>,_std::allocator<mp::pre::ValueNode_*>_>
                   *)0x171096);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
  ModelValues<mp::pre::ValueMap<mp::pre::ValueNode,_mp::pre::BasicValuePresolver_&>_>::ModelValues
            (in_stack_00000010,in_stack_00000008,unaff_retaddr);
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator(&local_39);
  this_00 = (EntryItems *)&local_71;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
  ModelValues<mp::pre::ValueMap<mp::pre::ValueNode,_mp::pre::BasicValuePresolver_&>_>::ModelValues
            (in_stack_00000010,in_stack_00000008,unaff_retaddr);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff90);
  std::allocator<char>::~allocator(&local_71);
  LinkRangeList::LinkRangeList((LinkRangeList *)0x171165);
  in_RDI[0x5f] = local_18;
  *(undefined4 *)(in_RDI + 0x60) = 0;
  BasicLink::EntryItems::EntryItems(this_00);
  return;
}

Assistant:

ValuePresolverImpl(Env& env, BasicLogger& bts) :
    BasicValuePresolver(env), bts_(bts) { }